

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

void VRSHFT(int NN,int L3,double *ZR,double *ZI,int *CONV,double *SR,double *SI,double *PR,
           double *PI,double *QPR,double *QPI,double *PVR,double *PVI,double ARE,double MRE,
           double ETA,double INFIN,double *HR,double *HI,double *QHR,double *QHI,double *SHR,
           double *SHI,double *TR,double *TI)

{
  int NN_00;
  int iVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  int iVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_60;
  double local_50;
  int local_38;
  int local_34;
  int BOOL;
  
  *(undefined8 *)CONV = *(undefined8 *)CONCAT44(in_register_00000034,L3);
  *SR = *ZR;
  *(undefined4 *)ZI = 0;
  dVar6 = ARE + MRE;
  bVar5 = false;
  uVar2 = 0;
  if (0 < NN) {
    uVar2 = (ulong)(uint)NN;
  }
  iVar1 = 0;
  local_50 = dVar6;
  local_34 = NN;
  while( true ) {
    if (iVar1 == 10) {
      return;
    }
    POLYEV(local_34,(double *)CONV,SR,SI,PR,PI,QPR,QPI,PVR);
    dVar7 = CMOD(QPI,PVR);
    dVar8 = CMOD((double *)CONV,SR);
    dVar9 = CMOD(PI,QPR);
    dVar9 = (dVar9 * MRE) / dVar6;
    for (lVar4 = 0; iVar3 = local_34, uVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      dVar10 = CMOD((double *)((long)PI + lVar4),(double *)((long)QPR + lVar4));
      dVar9 = dVar9 * dVar8 + dVar10;
    }
    if (dVar7 <= (dVar9 * dVar6 - dVar7 * MRE) * 20.0) break;
    if (iVar1 != 0) {
      if (((bVar5) || (dVar7 < local_50)) || (0.05 <= local_60)) {
        if (local_50 < dVar7 * 0.1) {
          return;
        }
      }
      else {
        dVar7 = ETA;
        if (ETA <= local_60) {
          dVar7 = local_60;
        }
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar8 = *(double *)CONV;
        dVar9 = *SR;
        *SR = dVar8 * dVar7 + (dVar7 + 1.0) * dVar9;
        *(double *)CONV = dVar8 * (dVar7 + 1.0) - dVar7 * dVar9;
        POLYEV(iVar3,(double *)CONV,SR,SI,PR,PI,QPR,QPI,PVR);
        iVar3 = 5;
        while (NN_00 = local_34, bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
          CALCT(&local_38,local_34,(double *)CONV,SR,PVI,HR,HI,QHR,ARE,INFIN,QPI,PVR,QHI,SHR);
          NEXTH(&local_38,NN_00,HI,QHR,PI,QPR,QHI,SHR,PVI,HR);
        }
        bVar5 = true;
        dVar7 = INFIN;
      }
    }
    local_50 = dVar7;
    iVar3 = local_34;
    CALCT(&local_38,local_34,(double *)CONV,SR,PVI,HR,HI,QHR,ARE,INFIN,QPI,PVR,QHI,SHR);
    NEXTH(&local_38,iVar3,HI,QHR,PI,QPR,QHI,SHR,PVI,HR);
    CALCT(&local_38,iVar3,(double *)CONV,SR,PVI,HR,HI,QHR,ARE,INFIN,QPI,PVR,QHI,SHR);
    if (local_38 == 0) {
      dVar7 = CMOD(QHI,SHR);
      dVar8 = CMOD((double *)CONV,SR);
      local_60 = dVar7 / dVar8;
      *(double *)CONV = *(double *)CONV + *QHI;
      *SR = *SR + *SHR;
    }
    iVar1 = iVar1 + 1;
  }
  *(undefined4 *)ZI = 1;
  *(undefined8 *)CONCAT44(in_register_00000034,L3) = *(undefined8 *)CONV;
  *ZR = *SR;
  return;
}

Assistant:

static void VRSHFT(int NN, int L3, double *ZR, double *ZI, int *CONV,double *SR, double *SI,double *PR, double *PI, double *QPR, double *QPI, double *PVR, double *PVI,
	double ARE, double MRE, double ETA, double INFIN, double *HR, double *HI, double *QHR, double *QHI, double *SHR, double *SHI, double *TR, double *TI) {
	/*
	C CARRIES OUT THE THIRD STAGE ITERATION.
	C L3 - LIMIT OF STEPS IN STAGE 3.
	C ZR,ZI   - ON ENTRY CONTAINS THE INITIAL ITERATE, IF THE
	C ITERATION CONVERGES IT CONTAINS THE FINAL ITERATE
	C ON EXIT.
	C CONV    -  .TRUE. IF ITERATION CONVERGES
	*/
	double MP, MS, OMP, RELSTP, R1, R2, TP;
	int B,BOOL,i,j;
	*SR = *ZR;
	*SI = *ZI;
	B = 0;
	*CONV = 0;


	for (i = 0; i < L3; ++i) {
		POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
		MP = CMOD(PVR,PVI);
		MS = CMOD(SR, SI);
		if (MP <= 20.0*ERREV(NN, QPR, QPI, MS, MP, ARE, MRE)) {
			*CONV = 1;
			*ZR = *SR;
			*ZI = *SI;
			break;
		}
		else {//10
			if (i == 0) {
				OMP = MP;
			}
			else {
				if (!(B == 1 || MP < OMP || RELSTP >= .05)) {
					TP = RELSTP;
					B = 1;
					if (RELSTP < ETA) {
						TP = ETA;
					}
					R1 = sqrt(TP);
					R2 = *SR * (1.0 + R1) - *SI*R1;
					*SI = *SR*R1 + *SI*(1.0 + R1);
					*SR = R2;
					POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
					for (j = 0; j < 5;++j) {
						CALCT(&BOOL,NN,SR,SI,HR,HI,QHR, QHI,ARE,INFIN,PVR, PVI,TR,TI);
						NEXTH(&BOOL,NN,QHR,QHI,QPR,QPI,TR, TI, HR,HI);
					}
					OMP = INFIN;
				}
				else {
					if (MP*0.1 > OMP) {
						break;
					}
					OMP = MP;
				}

			}

			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
			NEXTH(&BOOL, NN, QHR, QHI, QPR, QPI, TR, TI, HR, HI);
			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);

			if (BOOL == 0) {
				RELSTP = CMOD(TR, TI) / CMOD(SR, SI);
				*SR = *SR + *TR;
				*SI = *SI + *TI;
			}

		}
	}//60
}